

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

uint64_t CombinedShannonEntropy_C(uint32_t *X,uint32_t *Y)

{
  uint uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint local_44;
  
  lVar4 = 0;
  lVar7 = 0;
  uVar6 = 0;
  local_44 = 0;
  do {
    uVar1 = X[lVar4];
    uVar5 = Y[lVar4];
    if ((ulong)uVar1 == 0) {
      if ((ulong)uVar5 != 0) {
        if (uVar5 < 0x100) {
          uVar2 = kSLog2Table[uVar5];
        }
        else {
          uVar2 = (*VP8LFastSLog2Slow)(uVar5);
        }
        uVar6 = uVar6 + uVar5;
        lVar7 = lVar7 + uVar2;
      }
    }
    else {
      if (uVar1 < 0x100) {
        uVar2 = kSLog2Table[uVar1];
      }
      else {
        uVar2 = (*VP8LFastSLog2Slow)(uVar1);
      }
      uVar5 = uVar5 + uVar1;
      if (uVar5 < 0x100) {
        uVar3 = kSLog2Table[uVar5];
      }
      else {
        uVar3 = (*VP8LFastSLog2Slow)(uVar5);
      }
      local_44 = local_44 + uVar1;
      lVar7 = uVar2 + lVar7 + uVar3;
      uVar6 = uVar5 + uVar6;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  if (local_44 < 0x100) {
    uVar2 = kSLog2Table[local_44];
  }
  else {
    uVar2 = (*VP8LFastSLog2Slow)(local_44);
  }
  if (uVar6 < 0x100) {
    uVar3 = kSLog2Table[uVar6];
  }
  else {
    uVar3 = (*VP8LFastSLog2Slow)(uVar6);
  }
  return (uVar2 - lVar7) + uVar3;
}

Assistant:

static uint64_t CombinedShannonEntropy_C(const uint32_t X[256],
                                         const uint32_t Y[256]) {
  int i;
  uint64_t retval = 0;
  uint32_t sumX = 0, sumXY = 0;
  for (i = 0; i < 256; ++i) {
    const uint32_t x = X[i];
    if (x != 0) {
      const uint32_t xy = x + Y[i];
      sumX += x;
      retval += VP8LFastSLog2(x);
      sumXY += xy;
      retval += VP8LFastSLog2(xy);
    } else if (Y[i] != 0) {
      sumXY += Y[i];
      retval += VP8LFastSLog2(Y[i]);
    }
  }
  retval = VP8LFastSLog2(sumX) + VP8LFastSLog2(sumXY) - retval;
  return retval;
}